

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

void __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
::
construct<std::piecewise_construct_t_const&,std::tuple<google::protobuf::FileDescriptor_const*const&>,std::tuple<>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<google::protobuf::FileDescriptor_const*,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Hash,absl::lts_20250127::container_internal::HashEq<google::protobuf::FileDescriptor_const*,void>::Eq,std::allocator<std::pair<google::protobuf::FileDescriptor_const*const,std::vector<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>>>>>
           *this,slot_type *slot,piecewise_construct_t *args,
          tuple<const_google::protobuf::FileDescriptor_*const_&> *args_1,tuple<> *args_2)

{
  size_t c;
  
  c = *(size_t *)this;
  *(undefined8 *)this = 0xffffffffffffff9c;
  (slot->value).first =
       *(args_1->super__Tuple_impl<0UL,_const_google::protobuf::FileDescriptor_*const_&>).
        super__Head_base<0UL,_const_google::protobuf::FileDescriptor_*const_&,_false>._M_head_impl;
  (slot->value).second.
  super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (slot->value).second.
  super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (slot->value).second.
  super__Vector_base<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo,_std::allocator<google::protobuf::DescriptorPool::DeferredValidation::LifetimesInfo>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  CommonFields::set_capacity((CommonFields *)this,c);
  return;
}

Assistant:

size_t capacity() const { return capacity_; }